

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O1

bool __thiscall dg::debug::LLVMDG2Dot::dump(LLVMDG2Dot *this,char *new_file,char *dump_func_only)

{
  _Base_ptr graph;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  char *name;
  _Rb_tree_node_base *p_Var4;
  undefined1 auVar5 [16];
  
  bVar1 = DG2Dot<dg::LLVMNode>::ensureFile(&this->super_DG2Dot<dg::LLVMNode>,new_file);
  if (bVar1) {
    lVar3 = dg::getConstructedFunctions();
    DG2Dot<dg::LLVMNode>::start(&this->super_DG2Dot<dg::LLVMNode>);
    for (p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
        p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (dump_func_only == (char *)0x0) {
LAB_001174cc:
        graph = p_Var4[1]._M_parent;
        name = (char *)llvm::Value::getName();
        dumpSubgraph(this,(LLVMDependenceGraph *)graph,name);
      }
      else {
        auVar5 = llvm::Value::getName();
        __n = strlen(dump_func_only);
        if ((auVar5._8_8_ == __n) &&
           ((__n == 0 || (iVar2 = bcmp(auVar5._0_8_,dump_func_only,__n), iVar2 == 0))))
        goto LAB_001174cc;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(this->super_DG2Dot<dg::LLVMNode>).out,"}\n",2);
  }
  return bVar1;
}

Assistant:

bool dump(const char *new_file = nullptr,
              const char *dump_func_only = nullptr) override {
        // make sure we have the file opened
        if (!ensureFile(new_file))
            return false;

        const std::map<llvm::Value *, LLVMDependenceGraph *> &CF =
                getConstructedFunctions();

        start();

        for (const auto &F : CF) {
            if (dump_func_only && !F.first->getName().equals(dump_func_only))
                continue;

            dumpSubgraph(F.second, F.first->getName().data());
        }

        end();

        return true;
    }